

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlstring(void)

{
  bool bVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  size_t sVar20;
  undefined8 uVar21;
  int test_ret_9;
  int n_cur;
  uint uVar22;
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  int n_val_1;
  undefined8 *puVar26;
  int test_ret_7;
  char *pcVar27;
  int test_ret_8;
  int *piVar28;
  undefined4 *puVar29;
  int n_len;
  uint uVar30;
  int test_ret_1;
  int test_ret;
  int test_ret_3;
  int test_ret_18;
  int test_ret_2;
  int local_54;
  int local_48;
  int local_40;
  
  if (quiet == '\0') {
    puts("Testing xmlstring : 26 of 30 functions ...");
  }
  puVar26 = &DAT_00165d58;
  uVar22 = 0;
  iVar18 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar22 < 3) {
      uVar24 = *puVar26;
    }
    else {
      uVar24 = 0;
    }
    lVar19 = xmlCharStrdup(uVar24);
    if (lVar19 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCharStrdup",(ulong)(uint)(iVar5 - iVar4));
      iVar18 = iVar18 + 1;
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar22 != 4);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar22 = 0;
  do {
    piVar28 = &DAT_0016343c;
    uVar23 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar22 == 0) {
        bVar1 = false;
        pcVar27 = "foo";
      }
      else if (uVar22 == 2) {
        bVar1 = false;
        pcVar27 = "test/ent2";
      }
      else if (uVar22 == 1) {
        bVar1 = false;
        pcVar27 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar27 = (char *)0x0;
      }
      iVar5 = *piVar28;
      if ((bVar1) || (sVar20 = strlen(pcVar27), iVar5 <= (int)sVar20 + 1)) {
        lVar19 = xmlCharStrndup(pcVar27,iVar5);
        if (lVar19 != 0) {
          (*_xmlFree)(lVar19);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlCharStrndup",(ulong)(uint)(iVar5 - iVar4));
          local_54 = local_54 + 1;
          printf(" %d",(ulong)uVar22);
          printf(" %d",uVar23);
          putchar(10);
        }
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
      piVar28 = piVar28 + 1;
    } while (uVar30 != 4);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  xmlCheckUTF8(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    iVar6 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCheckUTF8",(ulong)(uint)(iVar6 - iVar4));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar18 = local_54 + iVar18;
  uVar22 = 0;
  iVar6 = 0;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    iVar7 = xmlMemBlocks();
    uVar24 = 0;
    if (bVar2) {
      uVar24 = 0x168a14;
    }
    xmlGetUTF8Char(0,uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetUTF8Char",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = 1;
    bVar1 = false;
  } while (bVar2);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar22 = 0;
  do {
    uVar30 = 0;
    puVar26 = &DAT_00165d70;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlStrEqual(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrEqual",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar22 = 0;
  do {
    uVar23 = 0;
    do {
      uVar30 = 0;
      puVar26 = &DAT_00165d70;
      do {
        iVar9 = xmlMemBlocks();
        if (uVar22 < 4) {
          uVar24 = (&DAT_00165d70)[uVar22];
        }
        else {
          uVar24 = 0;
        }
        if ((uint)uVar23 < 4) {
          uVar25 = (&DAT_00165d70)[uVar23];
        }
        else {
          uVar25 = 0;
        }
        if (uVar30 < 4) {
          uVar21 = *puVar26;
        }
        else {
          uVar21 = 0;
        }
        xmlStrQEqual(uVar24,uVar25,uVar21);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrQEqual",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",(ulong)uVar22);
          printf(" %d",uVar23);
          printf(" %d");
          putchar(10);
        }
        uVar30 = uVar30 + 1;
        puVar26 = puVar26 + 1;
      } while (uVar30 != 5);
      uVar30 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar30;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlStrcasecmp(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasecmp",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar10 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar11 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlStrcasestr(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar11 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcasestr",(ulong)(uint)(iVar12 - iVar11));
        iVar10 = iVar10 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar11 = 0;
  uVar22 = 0;
  do {
    uVar23 = 0;
    do {
      iVar12 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      uVar3 = (undefined1)(0xf82061 >> ((char)uVar23 * '\b' & 0x1fU));
      if (2 < (uint)uVar23) {
        uVar3 = 0;
      }
      xmlStrchr(uVar24,uVar3);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar12 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrchr",(ulong)(uint)(iVar13 - iVar12));
        iVar11 = iVar11 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d",uVar23);
        putchar(10);
      }
      uVar30 = (uint)uVar23 + 1;
      uVar23 = (ulong)uVar30;
    } while (uVar30 != 4);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar12 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar13 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlStrcmp(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrcmp",(ulong)(uint)(iVar14 - iVar13));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  puVar26 = &DAT_00165d70;
  uVar22 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar24 = *puVar26;
    }
    else {
      uVar24 = 0;
    }
    lVar19 = xmlStrdup(uVar24);
    if (lVar19 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrdup",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  puVar26 = &DAT_00165d70;
  uVar22 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar24 = *puVar26;
    }
    else {
      uVar24 = 0;
    }
    xmlStrlen(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStrlen",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  local_54 = 0;
  uVar22 = 0;
  do {
    iVar15 = 0;
    do {
      uVar23 = 0;
      piVar28 = &DAT_0016343c;
      do {
        iVar16 = xmlMemBlocks();
        if (uVar22 < 4) {
          uVar24 = (&DAT_00165d70)[uVar22];
        }
        else {
          uVar24 = 0;
        }
        switch(iVar15) {
        case 0:
          bVar1 = false;
          pcVar27 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar27 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar27 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar1 = false;
          pcVar27 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar27 = (char *)0x0;
        }
        iVar17 = *piVar28;
        if ((bVar1) || (sVar20 = strlen(pcVar27), iVar17 <= (int)sVar20 + 1)) {
          xmlStrncasecmp(uVar24,pcVar27,iVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          if (iVar16 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncasecmp",(ulong)(uint)(iVar17 - iVar16));
            local_54 = local_54 + 1;
            printf(" %d",(ulong)uVar22);
            printf(" %d",iVar15);
            printf(" %d",uVar23);
            putchar(10);
          }
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        piVar28 = piVar28 + 1;
      } while (uVar30 != 4);
      iVar15 = iVar15 + 1;
    } while (iVar15 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar18 = iVar13 + iVar14 +
           iVar18 + (uint)(iVar4 != iVar5) + iVar6 + iVar7 + iVar8 + iVar9 + iVar10 + iVar11 +
           iVar12 + local_54;
  local_54 = 0;
  uVar22 = 0;
  do {
    iVar4 = 0;
    do {
      uVar23 = 0;
      piVar28 = &DAT_0016343c;
      do {
        iVar5 = xmlMemBlocks();
        if (uVar22 < 4) {
          uVar24 = (&DAT_00165d70)[uVar22];
        }
        else {
          uVar24 = 0;
        }
        switch(iVar4) {
        case 0:
          bVar1 = false;
          pcVar27 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar27 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar27 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar1 = false;
          pcVar27 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar27 = (char *)0x0;
        }
        iVar6 = *piVar28;
        if ((bVar1) || (sVar20 = strlen(pcVar27), iVar6 <= (int)sVar20 + 1)) {
          lVar19 = xmlStrncatNew(uVar24,pcVar27,iVar6);
          if (lVar19 != 0) {
            (*_xmlFree)(lVar19);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncatNew",(ulong)(uint)(iVar6 - iVar5));
            local_54 = local_54 + 1;
            printf(" %d",(ulong)uVar22);
            printf(" %d",iVar4);
            printf(" %d",uVar23);
            putchar(10);
          }
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        piVar28 = piVar28 + 1;
      } while (uVar30 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar18 = iVar18 + local_54;
  local_54 = 0;
  uVar22 = 0;
  do {
    iVar4 = 0;
    do {
      uVar23 = 0;
      piVar28 = &DAT_0016343c;
      do {
        iVar5 = xmlMemBlocks();
        if (uVar22 < 4) {
          uVar24 = (&DAT_00165d70)[uVar22];
        }
        else {
          uVar24 = 0;
        }
        switch(iVar4) {
        case 0:
          bVar1 = false;
          pcVar27 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar27 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar27 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar1 = false;
          pcVar27 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar27 = (char *)0x0;
        }
        iVar6 = *piVar28;
        if ((bVar1) || (sVar20 = strlen(pcVar27), iVar6 <= (int)sVar20 + 1)) {
          xmlStrncmp(uVar24,pcVar27,iVar6);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncmp",(ulong)(uint)(iVar6 - iVar5));
            local_54 = local_54 + 1;
            printf(" %d",(ulong)uVar22);
            printf(" %d",iVar4);
            printf(" %d",uVar23);
            putchar(10);
          }
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        piVar28 = piVar28 + 1;
      } while (uVar30 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar22 = 0;
  do {
    piVar28 = &DAT_0016343c;
    uVar23 = 0;
    do {
      iVar4 = xmlMemBlocks();
      switch(uVar22) {
      case 0:
        bVar1 = false;
        pcVar27 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar27 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar27 = anon_var_dwarf_1b0;
        break;
      case 3:
        bVar1 = false;
        pcVar27 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar27 = (char *)0x0;
      }
      iVar5 = *piVar28;
      if ((bVar1) || (sVar20 = strlen(pcVar27), iVar5 <= (int)sVar20 + 1)) {
        lVar19 = xmlStrndup(pcVar27,iVar5);
        if (lVar19 != 0) {
          (*_xmlFree)(lVar19);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrndup",(ulong)(uint)(iVar5 - iVar4));
          local_48 = local_48 + 1;
          printf(" %d",(ulong)uVar22);
          printf(" %d",uVar23);
          putchar(10);
        }
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
      piVar28 = piVar28 + 1;
    } while (uVar30 != 4);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlStrstr(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlStrstr",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar18 = iVar18 + local_54 + local_48;
  local_54 = 0;
  iVar5 = 0;
  do {
    uVar22 = 0;
    do {
      uVar23 = 0;
      piVar28 = &DAT_0016343c;
      do {
        iVar6 = xmlMemBlocks();
        switch(iVar5) {
        case 0:
          bVar1 = false;
          pcVar27 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar27 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar27 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar1 = false;
          pcVar27 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar27 = (char *)0x0;
        }
        iVar7 = -1;
        if (uVar22 < 4) {
          iVar7 = (&DAT_0016343c)[uVar22];
        }
        iVar8 = *piVar28;
        if ((bVar1) ||
           (sVar20 = strlen(pcVar27), iVar9 = (int)sVar20 + 1, iVar8 <= iVar9 && iVar7 <= iVar9)) {
          lVar19 = xmlStrsub(pcVar27,iVar7,iVar8);
          if (lVar19 != 0) {
            (*_xmlFree)(lVar19);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrsub",(ulong)(uint)(iVar7 - iVar6));
            local_54 = local_54 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar22);
            printf(" %d",uVar23);
            putchar(10);
          }
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        piVar28 = piVar28 + 1;
      } while (uVar30 != 4);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 4);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlUTF8Charcmp(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Charcmp",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  puVar26 = &DAT_00165d70;
  uVar22 = 0;
  iVar6 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar24 = *puVar26;
    }
    else {
      uVar24 = 0;
    }
    xmlUTF8Size(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Size",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  puVar26 = &DAT_00165d70;
  uVar22 = 0;
  local_40 = 0;
  do {
    iVar7 = xmlMemBlocks();
    if (uVar22 < 4) {
      uVar24 = *puVar26;
    }
    else {
      uVar24 = 0;
    }
    xmlUTF8Strlen(uVar24);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlUTF8Strlen",(ulong)(uint)(iVar8 - iVar7));
      local_40 = local_40 + 1;
      printf(" %d",(ulong)uVar22);
      putchar(10);
    }
    uVar22 = uVar22 + 1;
    puVar26 = puVar26 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar22 = 0;
  do {
    puVar26 = &DAT_00165d70;
    uVar30 = 0;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      if (uVar30 < 4) {
        uVar25 = *puVar26;
      }
      else {
        uVar25 = 0;
      }
      xmlUTF8Strloc(uVar24,uVar25);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strloc",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d");
        putchar(10);
      }
      uVar30 = uVar30 + 1;
      puVar26 = puVar26 + 1;
    } while (uVar30 != 5);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar23 = 0;
  do {
    piVar28 = &DAT_0016343c;
    uVar22 = 0;
    do {
      iVar8 = xmlMemBlocks();
      switch(uVar23) {
      case 0:
        bVar1 = false;
        pcVar27 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar27 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar27 = anon_var_dwarf_1b0;
        break;
      case 3:
        bVar1 = false;
        pcVar27 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar27 = (char *)0x0;
      }
      iVar9 = *piVar28;
      if ((bVar1) || (sVar20 = strlen(pcVar27), iVar9 <= (int)sVar20 + 1)) {
        lVar19 = xmlUTF8Strndup(pcVar27,iVar9);
        if (lVar19 != 0) {
          (*_xmlFree)(lVar19);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strndup",(ulong)(uint)(iVar9 - iVar8));
          local_48 = local_48 + 1;
          printf(" %d",uVar23);
          printf(" %d",(ulong)uVar22);
          putchar(10);
        }
      }
      uVar22 = uVar22 + 1;
      piVar28 = piVar28 + 1;
    } while (uVar22 != 4);
    uVar22 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar22;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  iVar18 = local_40 + iVar7 + iVar18 + iVar4 + local_54 + iVar5 + iVar6 + local_48;
  iVar4 = 0;
  uVar22 = 0;
  do {
    puVar29 = &DAT_0016343c;
    uVar23 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar22 < 4) {
        uVar24 = (&DAT_00165d70)[uVar22];
      }
      else {
        uVar24 = 0;
      }
      xmlUTF8Strpos(uVar24,*puVar29);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlUTF8Strpos",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar22);
        printf(" %d",uVar23);
        putchar(10);
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
      puVar29 = puVar29 + 1;
    } while (uVar30 != 4);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  local_48 = 0;
  uVar22 = 0;
  do {
    piVar28 = &DAT_0016343c;
    uVar23 = 0;
    do {
      iVar5 = xmlMemBlocks();
      switch(uVar22) {
      case 0:
        bVar1 = false;
        pcVar27 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar27 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar27 = anon_var_dwarf_1b0;
        break;
      case 3:
        bVar1 = false;
        pcVar27 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar27 = (char *)0x0;
      }
      iVar6 = *piVar28;
      if ((bVar1) || (sVar20 = strlen(pcVar27), iVar6 <= (int)sVar20 + 1)) {
        xmlUTF8Strsize(pcVar27,iVar6);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlUTF8Strsize",(ulong)(uint)(iVar6 - iVar5));
          local_48 = local_48 + 1;
          printf(" %d",(ulong)uVar22);
          printf(" %d",uVar23);
          putchar(10);
        }
      }
      uVar30 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar30;
      piVar28 = piVar28 + 1;
    } while (uVar30 != 4);
    uVar22 = uVar22 + 1;
  } while (uVar22 != 5);
  function_tests = function_tests + 1;
  local_54 = 0;
  iVar5 = 0;
  do {
    uVar22 = 0;
    do {
      uVar23 = 0;
      piVar28 = &DAT_0016343c;
      do {
        iVar6 = xmlMemBlocks();
        switch(iVar5) {
        case 0:
          bVar1 = false;
          pcVar27 = "foo";
          break;
        case 1:
          bVar1 = false;
          pcVar27 = "<foo/>";
          break;
        case 2:
          bVar1 = false;
          pcVar27 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar1 = false;
          pcVar27 = " 2ab ";
          break;
        default:
          bVar1 = true;
          pcVar27 = (char *)0x0;
        }
        iVar7 = -1;
        if (uVar22 < 4) {
          iVar7 = (&DAT_0016343c)[uVar22];
        }
        iVar8 = *piVar28;
        if ((bVar1) ||
           (sVar20 = strlen(pcVar27), iVar9 = (int)sVar20 + 1, iVar8 <= iVar9 && iVar7 <= iVar9)) {
          lVar19 = xmlUTF8Strsub(pcVar27,iVar7,iVar8);
          if (lVar19 != 0) {
            (*_xmlFree)(lVar19);
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlUTF8Strsub",(ulong)(uint)(iVar7 - iVar6));
            local_54 = local_54 + 1;
            printf(" %d",iVar5);
            printf(" %d",(ulong)uVar22);
            printf(" %d",uVar23);
            putchar(10);
          }
        }
        uVar30 = (int)uVar23 + 1;
        uVar23 = (ulong)uVar30;
        piVar28 = piVar28 + 1;
      } while (uVar30 != 4);
      uVar22 = uVar22 + 1;
    } while (uVar22 != 4);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 5);
  function_tests = function_tests + 1;
  uVar22 = iVar18 + iVar4 + local_48 + local_54;
  if (uVar22 != 0) {
    printf("Module xmlstring: %d errors\n",(ulong)uVar22);
  }
  return uVar22;
}

Assistant:

static int
test_xmlstring(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlstring : 26 of 30 functions ...\n");
    test_ret += test_xmlCharStrdup();
    test_ret += test_xmlCharStrndup();
    test_ret += test_xmlCheckUTF8();
    test_ret += test_xmlGetUTF8Char();
    test_ret += test_xmlStrEqual();
    test_ret += test_xmlStrPrintf();
    test_ret += test_xmlStrQEqual();
    test_ret += test_xmlStrVPrintf();
    test_ret += test_xmlStrcasecmp();
    test_ret += test_xmlStrcasestr();
    test_ret += test_xmlStrchr();
    test_ret += test_xmlStrcmp();
    test_ret += test_xmlStrdup();
    test_ret += test_xmlStrlen();
    test_ret += test_xmlStrncasecmp();
    test_ret += test_xmlStrncatNew();
    test_ret += test_xmlStrncmp();
    test_ret += test_xmlStrndup();
    test_ret += test_xmlStrstr();
    test_ret += test_xmlStrsub();
    test_ret += test_xmlUTF8Charcmp();
    test_ret += test_xmlUTF8Size();
    test_ret += test_xmlUTF8Strlen();
    test_ret += test_xmlUTF8Strloc();
    test_ret += test_xmlUTF8Strndup();
    test_ret += test_xmlUTF8Strpos();
    test_ret += test_xmlUTF8Strsize();
    test_ret += test_xmlUTF8Strsub();

    if (test_ret != 0)
	printf("Module xmlstring: %d errors\n", test_ret);
    return(test_ret);
}